

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseInlineExports(WastParser *this,ModuleFieldList *fields,ExternalKind kind)

{
  ModuleField *pMVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  Result RVar7;
  ModuleField *pMVar8;
  ModuleFieldList *pMVar9;
  Token local_70;
  
  do {
    bVar6 = PeekMatchLpar(this,Export);
    if (!bVar6) {
      return (Result)Ok;
    }
    RVar7 = Expect(this,Lpar);
    if (RVar7.enum_ == Error) {
      return (Result)Error;
    }
    GetToken(&local_70,this);
    uVar5 = local_70.loc.field_1._8_8_;
    uVar4 = local_70.loc.field_1.field_1.offset;
    pcVar3 = local_70.loc.filename._M_str;
    sVar2 = local_70.loc.filename._M_len;
    pMVar8 = (ModuleField *)operator_new(0xb0);
    (pMVar8->super_intrusive_list_base<wabt::ModuleField>).next_ = (ModuleField *)0x0;
    (pMVar8->super_intrusive_list_base<wabt::ModuleField>).prev_ = (ModuleField *)0x0;
    pMVar8->_vptr_ModuleField = (_func_int **)&PTR__ModuleField_00242ba0;
    (pMVar8->loc).filename._M_len = sVar2;
    (pMVar8->loc).filename._M_str = pcVar3;
    (pMVar8->loc).field_1.field_1.offset = uVar4;
    *(undefined8 *)((long)&(pMVar8->loc).field_1 + 8) = uVar5;
    pMVar8->type_ = Export;
    pMVar8->_vptr_ModuleField = (_func_int **)&PTR__ExportModuleField_00242fe8;
    pMVar8[1]._vptr_ModuleField =
         (_func_int **)&pMVar8[1].super_intrusive_list_base<wabt::ModuleField>.prev_;
    pMVar8[1].super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
    *(undefined1 *)&pMVar8[1].super_intrusive_list_base<wabt::ModuleField>.prev_ = 0;
    Var::Var((Var *)&pMVar8[1].loc.field_1.field_0);
    *(ExternalKind *)&pMVar8[1].loc.filename._M_str = kind;
    RVar7 = Expect(this,Export);
    if (((RVar7.enum_ == Error) ||
        (RVar7 = ParseQuotedText(this,(string *)(pMVar8 + 1),true), RVar7.enum_ == Error)) ||
       (RVar7 = Expect(this,Rpar), RVar7.enum_ == Error)) {
      bVar6 = false;
    }
    else {
      if (((pMVar8->super_intrusive_list_base<wabt::ModuleField>).prev_ != (ModuleField *)0x0) ||
         ((pMVar8->super_intrusive_list_base<wabt::ModuleField>).next_ != (ModuleField *)0x0)) {
        __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                      ,0x1bd,
                      "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
                     );
      }
      pMVar1 = fields->last_;
      pMVar9 = fields;
      if (pMVar1 != (ModuleField *)0x0) {
        (pMVar8->super_intrusive_list_base<wabt::ModuleField>).prev_ = pMVar1;
        pMVar9 = (ModuleFieldList *)&pMVar1->super_intrusive_list_base<wabt::ModuleField>;
      }
      pMVar9->first_ = pMVar8;
      fields->last_ = pMVar8;
      fields->size_ = fields->size_ + 1;
      bVar6 = true;
      pMVar8 = (ModuleField *)0x0;
    }
    if (pMVar8 != (ModuleField *)0x0) {
      (*pMVar8->_vptr_ModuleField[1])(pMVar8);
    }
  } while (bVar6);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseInlineExports(ModuleFieldList* fields,
                                      ExternalKind kind) {
  WABT_TRACE(ParseInlineExports);
  while (PeekMatchLpar(TokenType::Export)) {
    EXPECT(Lpar);
    auto field = std::make_unique<ExportModuleField>(GetLocation());
    field->export_.kind = kind;
    EXPECT(Export);
    CHECK_RESULT(ParseQuotedText(&field->export_.name));
    EXPECT(Rpar);
    fields->push_back(std::move(field));
  }
  return Result::Ok;
}